

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Directed_Energy_Fire_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pKVar3;
  KStringStream ss;
  KString local_2d8;
  KString local_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2d8,&this->super_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Directed Energy Fire PDU-\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Firing Entity ID:\n",0x12);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_FiringEntityID);
  UTILS::IndentString(&local_218,&local_1d8,Tabs,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EventID);
  UTILS::IndentString(&local_238,&local_1f8,Tabs_00,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Munition Type:              ",0x1c);
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_258,&this->m_MunTyp);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Shot Start Time:            ",0x1c);
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_278,&this->m_ShotStartTime);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Cumulative Shot Time:       ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32CumulativeShotTime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Emitter Location:           ",0x1c);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_298,&this->m_EmitterLoc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Aperture Diameter:          ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32AperDiameter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Wavelength:                 ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32Wavelength);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Peak Irradiance:            ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32PeakIrradiance);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Pulse Repetition Frequency: ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32PulseRepFreq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Pulse Width:                ",0x1c);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32PulseWidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Flags:\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tWeapon State: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tState Update: ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Pulse Shape:                ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringBeamSpotShape_abi_cxx11_
            (&local_2b8,(ENUMS *)(ulong)this->m_ui8PulseShp,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Number Of DE Records:       ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"DE Records:\n",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  pKVar1 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vDeRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Directed_Energy_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Directed Energy Fire PDU-\n"
       << "Firing Entity ID:\n"
       << IndentString( m_FiringEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Munition Type:              " << m_MunTyp.GetAsString()
       << "Shot Start Time:            " << m_ShotStartTime.GetAsString()
       << "Cumulative Shot Time:       " << m_f32CumulativeShotTime                       << "\n"
       << "Emitter Location:           " << m_EmitterLoc.GetAsString()
       << "Aperture Diameter:          " << m_f32AperDiameter                             << "\n"
       << "Wavelength:                 " << m_f32Wavelength                               << "\n"
       << "Peak Irradiance:            " << m_f32PeakIrradiance                           << "\n"
       << "Pulse Repetition Frequency: " << m_f32PulseRepFreq                             << "\n"
       << "Pulse Width:                " << m_f32PulseWidth                               << "\n"
       << "Flags:\n"
       << "\tWeapon State: "             << m_DeUnion.m_ui16WeaponState                   << "\n"
       << "\tState Update: "             << m_DeUnion.m_ui16StateUpdate                   << "\n"
       << "Pulse Shape:                " << GetEnumAsStringBeamSpotShape( m_ui8PulseShp ) << "\n"
       << "Number Of DE Records:       " << m_ui16NumDERecs                               << "\n"
       << "DE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDeRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDeRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}